

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O0

bool __thiscall
MeCab::RewritePattern::rewrite(RewritePattern *this,size_t size,char **input,string *output)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  long lVar5;
  ostream *poVar6;
  const_reference pvVar7;
  size_type sVar8;
  string *in_RCX;
  long in_RDX;
  ulong in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  size_t n;
  char *p;
  char *end;
  char *begin;
  string elm;
  size_t i_1;
  size_t i;
  ostream *in_stack_ffffffffffffff10;
  die local_8e;
  byte local_8d;
  die local_79;
  ulong local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  string local_58 [32];
  ulong local_38;
  ulong local_30;
  string *local_28;
  long local_20;
  ulong local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (local_18 < sVar3) {
    local_1 = false;
  }
  else {
    for (local_30 = 0; uVar1 = local_30,
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI), uVar1 < sVar3; local_30 = local_30 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,local_30);
      std::__cxx11::string::c_str();
      bVar2 = anon_unknown.dwarf_6b6b0::match_rewrite_pattern(in_stack_00000008,unaff_retaddr);
      if (!bVar2) {
        return false;
      }
    }
    std::__cxx11::string::clear();
    for (local_38 = 0; uVar1 = local_38,
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI + 1), uVar1 < sVar3; local_38 = local_38 + 1) {
      std::__cxx11::string::string(local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI + 1,local_38);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_60 = pcVar4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI + 1,local_38);
      lVar5 = std::__cxx11::string::size();
      local_68 = pcVar4 + lVar5;
      for (local_70 = local_60; local_70 < local_68; local_70 = local_70 + 1) {
        if (*local_70 == '$') {
          local_78 = 0;
          while ((local_70 = local_70 + 1, local_70 < local_68 && ((int)*local_70 - 0x30U < 10))) {
            local_78 = local_78 * 10 + (long)(*local_70 + -0x30);
          }
          local_8d = 0;
          if ((local_78 == 0) || (local_18 <= local_78 - 1)) {
            die::die(&local_79);
            local_8d = 1;
            poVar6 = std::operator<<((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,"(");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x69);
            poVar6 = std::operator<<(poVar6,") [");
            poVar6 = std::operator<<(poVar6,"n > 0 && (n - 1) < size");
            poVar6 = std::operator<<(poVar6,"] ");
            poVar6 = std::operator<<(poVar6," out of range: [");
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](in_RDI + 1,local_38);
            in_stack_ffffffffffffff10 = std::operator<<(poVar6,(string *)pvVar7);
            poVar6 = std::operator<<(in_stack_ffffffffffffff10,"] ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_78);
            die::operator&(&local_79,poVar6);
          }
          if ((local_8d & 1) != 0) {
            die::~die((die *)0x1415df);
          }
          std::__cxx11::string::operator+=(local_58,*(char **)(local_20 + -8 + local_78 * 8));
          if (local_70 < local_68) {
            std::__cxx11::string::operator+=(local_58,*local_70);
          }
        }
        else {
          std::__cxx11::string::operator+=(local_58,*local_70);
        }
      }
      bVar2 = escape_csv_element((string *)in_stack_ffffffffffffff10);
      if (!bVar2) {
        die::die(&local_8e);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                );
        poVar6 = std::operator<<(poVar6,"(");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x71);
        poVar6 = std::operator<<(poVar6,") [");
        poVar6 = std::operator<<(poVar6,"escape_csv_element(&elm)");
        poVar6 = std::operator<<(poVar6,"] ");
        die::operator&(&local_8e,poVar6);
        die::~die((die *)0x1417b5);
      }
      std::__cxx11::string::operator+=(local_28,local_58);
      sVar3 = local_38 + 1;
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI + 1);
      if (sVar3 != sVar8) {
        std::__cxx11::string::operator+=(local_28,",");
      }
      std::__cxx11::string::~string(local_58);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool RewritePattern::rewrite(size_t size,
                             const char **input,
                             std::string *output) const {
  if (spat_.size() > size) return false;
  for (size_t i = 0; i < spat_.size(); ++i) {
    if (!match_rewrite_pattern(spat_[i].c_str(), input[i]))
      return false;
  }

  output->clear();
  for (size_t i = 0; i < dpat_.size(); ++i) {
    std::string elm;
    const char *begin = dpat_[i].c_str();
    const char *end = begin + dpat_[i].size();
    for (const char *p = begin; p < end; ++p) {
      if (*p == '$') {
        ++p;
        size_t n = 0;
        for (; p < end; ++p) {
          switch (*p) {
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9':
              n = 10 * n + (*p - '0');
              break;
            default:
              goto NEXT;
          }
        }
     NEXT:
        CHECK_DIE(n > 0 && (n - 1) < size)
            << " out of range: [" << dpat_[i] << "] " << n;
        elm += input[n - 1];
        if (p < end) elm += *p;
      } else {
        elm += *p;
      }
    }
    CHECK_DIE(escape_csv_element(&elm));
    *output += elm;
    if (i + 1 != dpat_.size()) *output += ",";
  }

  return true;
}